

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O3

void ex1(void)

{
  int *piVar1;
  ostream *poVar2;
  ulong uVar3;
  uint uVar4;
  iterator iVar5;
  EVP_PKEY_CTX *ctx;
  ulong uVar6;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  endnodes;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  in;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ou;
  bool local_1f9;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1f8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1e0;
  allocator_type local_1c1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1c0;
  undefined1 local_1a8 [16];
  pointer local_198;
  pointer pvStack_190;
  pointer local_188;
  pointer local_180;
  pointer pvStack_178;
  pointer local_170;
  pointer local_168;
  pointer pvStack_160;
  pointer local_158;
  pointer local_150;
  pointer piStack_148;
  pointer local_140;
  pointer piStack_138;
  pointer local_130;
  pointer piStack_128;
  pointer local_120;
  pointer piStack_118;
  pointer local_110;
  pointer piStack_108;
  pointer local_100;
  pointer piStack_f8;
  pointer local_e8;
  pointer piStack_e0;
  pointer local_d8;
  pointer piStack_d0;
  pointer local_c8;
  pointer piStack_c0;
  vector<bool,_std::allocator<bool>_> local_b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_88;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_198 = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_1e0,0xf,(value_type *)local_1a8,(allocator_type *)&local_b0);
  if ((_func_int **)local_1a8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  local_1a8._0_4_ = 2;
  iVar5._M_current =
       local_1e0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xc].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1e0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xc].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xc,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1e0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xc].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1e0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xc].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 2;
    iVar5._M_current = iVar5._M_current + 1;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xc].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 1;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xc,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 1;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xc].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 10;
  iVar5._M_current =
       local_1e0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1e0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xd].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xd,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1e0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xd].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1e0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xd].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 10;
    iVar5._M_current = iVar5._M_current + 1;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xd;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xd,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1e0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xd].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1e0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xd].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xd;
    iVar5._M_current = iVar5._M_current + 1;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 3;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xd,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1e0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xd].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1e0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xd].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 3;
    iVar5._M_current = iVar5._M_current + 1;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 5;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xd,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 5;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 9;
  iVar5._M_current =
       local_1e0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1e0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xe].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xe,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1e0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xe].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1e0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xe].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 9;
    iVar5._M_current = iVar5._M_current + 1;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 7;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xe,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1e0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xe].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1e0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xe].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 7;
    iVar5._M_current = iVar5._M_current + 1;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xe,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1e0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xe].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1e0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xe].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0;
    iVar5._M_current = iVar5._M_current + 1;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 4;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xe,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 4;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xc;
  iVar5._M_current =
       local_1e0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1e0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[8].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 8,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1e0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1e0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[8].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xc;
    iVar5._M_current = iVar5._M_current + 1;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 6;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 8,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 6;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 8;
  iVar5._M_current =
       ((local_1e0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = ((local_1e0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,iVar5,(int *)local_1a8);
    iVar5._M_current =
         ((local_1e0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = ((local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 8;
    iVar5._M_current = iVar5._M_current + 1;
    ((local_1e0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xb;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xb;
    ((local_1e0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_198 = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_1c0,0xf,(value_type *)local_1a8,(allocator_type *)&local_b0);
  if ((_func_int **)local_1a8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  local_1a8._0_4_ = 3;
  iVar5._M_current =
       local_1c0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xc].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1c0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xc].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xc,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1c0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xc].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1c0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xc].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 3;
    iVar5._M_current = iVar5._M_current + 1;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xc].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xc,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xc].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xb;
  iVar5._M_current =
       local_1c0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1c0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xd].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xd,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1c0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xd].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1c0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xd].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xb;
    iVar5._M_current = iVar5._M_current + 1;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 2;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xd,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1c0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xd].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1c0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xd].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 2;
    iVar5._M_current = iVar5._M_current + 1;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 4;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xd,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 4;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 1;
  iVar5._M_current =
       local_1c0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1c0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xe].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xe,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1c0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xe].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1c0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xe].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 1;
    iVar5._M_current = iVar5._M_current + 1;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 5;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xe,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1c0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xe].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1c0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xe].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 5;
    iVar5._M_current = iVar5._M_current + 1;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 6;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xe,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 6;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 7;
  iVar5._M_current =
       local_1c0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1c0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[8].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 8,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1c0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1c0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[8].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 7;
    iVar5._M_current = iVar5._M_current + 1;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 8;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 8,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 8;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 9;
  iVar5._M_current =
       ((local_1c0.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = ((local_1c0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,iVar5,(int *)local_1a8);
    iVar5._M_current =
         ((local_1c0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = ((local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 9;
    iVar5._M_current = iVar5._M_current + 1;
    ((local_1c0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 10;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 10;
    ((local_1c0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xd;
  iVar5._M_current =
       local_1c0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      local_1c0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 8,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xd;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xc;
  iVar5._M_current =
       local_1c0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      local_1c0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xd,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xc;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_198 = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_1f8,0x10,(value_type *)local_1a8,(allocator_type *)&local_b0);
  if ((_func_int **)local_1a8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  local_1a8._0_4_ = 0xc;
  iVar5._M_current =
       ((local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = ((local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,iVar5,(int *)local_1a8);
    iVar5._M_current =
         ((local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = ((local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xc;
    iVar5._M_current = iVar5._M_current + 1;
    ((local_1f8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xe;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xe;
    ((local_1f8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xe;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[1].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xe;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xc;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xc;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xd;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[2].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xd;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xc;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xc;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xc;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[3].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 3,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[3].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xc;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xd;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 3,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xd;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xd;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[4].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[4].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 4,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[4].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[4].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xd;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xe;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 4,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xe;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xe;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[5].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 5,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[5].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xe;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xd;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 5,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xd;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xe;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[6].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[6].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 6,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[6].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[6].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xe;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[6].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 8;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 6,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 8;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[6].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 8;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[7].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[7].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 7,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[7].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[7].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 8;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[7].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xe;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 7,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xe;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[7].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 8;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[8].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 8,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[8].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 8;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 8,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[8].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[9].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[9].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 9,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[9].super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[9].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[9].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xe;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 9,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xe;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[9].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[10].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[10].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 10,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[10].super__Vector_base<int,_std::allocator<int>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[10].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[10].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xd;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 10,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xd;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[10].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xd;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xb].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xb].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xb,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xb].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xb].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xd;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xb].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xb,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xb].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xd;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xc].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xc].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xc,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xc].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xc].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xd;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xc].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 8;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xc,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 8;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xc].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 8;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xd].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xd,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xd].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xd].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 8;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xd;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xd,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xd;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xd].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 10;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xe].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xe,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xe].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xe].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 10;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 0xb;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xe,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xb;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xe].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xb;
  iVar5._M_current =
       local_1f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xf].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = local_1f8.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xf].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xf,iVar5,(int *)local_1a8);
    iVar5._M_current =
         local_1f8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[0xf].
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = local_1f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0xf].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar5._M_current = 0xb;
    iVar5._M_current = iVar5._M_current + 1;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xf].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_1a8._0_4_ = 10;
  if (iVar5._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1f8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xf,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 10;
    local_1f8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xf].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xf;
  iVar5._M_current =
       local_1e0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[10].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      local_1e0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[10].super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 10,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xf;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[10].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xe;
  iVar5._M_current =
       local_1e0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xb].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      local_1e0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0xb].super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1e0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xb,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xe;
    local_1e0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xb].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xe;
  iVar5._M_current =
       local_1c0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[10].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      local_1c0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[10].super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 10,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xe;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[10].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_1a8._0_4_ = 0xf;
  iVar5._M_current =
       local_1c0.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0xb].super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      local_1c0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0xb].super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_1c0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 0xb,iVar5,(int *)local_1a8);
  }
  else {
    *iVar5._M_current = 0xf;
    local_1c0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xb].super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_68,&local_1f8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_88,&local_1e0);
  ctx = (EVP_PKEY_CTX *)&local_1c0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)ctx);
  local_1a8._0_8_ = &PTR_DFS_0020fc58;
  local_1a8._8_4_ = 0xc;
  local_198 = local_68.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pvStack_190 = local_68.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_188 = local_68.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180 = local_88.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pvStack_178 = local_88.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_170 = local_88.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = local_48.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pvStack_160 = local_48.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_158 = local_48.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = (pointer)0x0;
  piStack_f8 = (pointer)0x0;
  local_110 = (pointer)0x0;
  piStack_108 = (pointer)0x0;
  local_120 = (pointer)0x0;
  piStack_118 = (pointer)0x0;
  local_130 = (pointer)0x0;
  piStack_128 = (pointer)0x0;
  local_140 = (pointer)0x0;
  piStack_138 = (pointer)0x0;
  local_150 = (pointer)0x0;
  piStack_148 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  piStack_c0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  piStack_d0 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  piStack_e0 = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_68);
  LengauerTarjan::init((LengauerTarjan *)local_1a8,ctx);
  (**(_func_int **)(local_1a8._0_8_ + 0x10))();
  (**(_func_int **)(local_1a8._0_8_ + 0x18))();
  local_1f9 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_b0,
             ((long)local_1e0.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1e0.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_1f9
             ,&local_1c1);
  if (local_1e0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1e0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,piStack_108[(int)(uVar4 - 1)]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      uVar6 = (ulong)uVar4;
      uVar3 = ((long)local_1e0.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1e0.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar4 = uVar4 + 1;
    } while (uVar6 <= uVar3 && uVar3 - uVar6 != 0);
  }
  local_1f9 = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_1f9,1);
  if (local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  LengauerTarjan::~LengauerTarjan((LengauerTarjan *)local_1a8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_1f8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_1c0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_1e0);
  return;
}

Assistant:

void LengauerTarjan::find_doms() {
	// for (int i = 0; i < preds.size(); i++) {
	//     cout <<"Preds of "<<i<<": ";
	//     for (int j = 0; j < preds[i].size(); j++) {
	//             cout <<preds[i][j]<<", ";
	//     }
	//     cout<<endl;
	// }
	// cout << "Semi ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< semi[i]<<") ";
	// cout<<endl;
	// cout << "vertex ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< vertex[i]<<") ";
	// cout<<endl;
	// cout << "label ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< label[i]<<") ";
	// cout<<endl;
	// cout << "parent ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< parent[i]<<") ";
	// cout<<endl;
	// cout <<"count "<<count<<endl;

	std::vector<std::vector<int> > buckets =
			std::vector<std::vector<int> >(in.size(), std::vector<int>());

	for (int i = count; i >= 1; i--) {
		const int w = vertex[i];
		std::vector<int>::iterator it;
		for (it = preds[w].begin(); it != preds[w].end(); it++) {
			const int v = *it;
			const int u = EVAL(v);
			if (semi[u] < semi[w]) {
				semi[w] = semi[u];
			}
		}
		buckets[vertex[semi[w]]].push_back(w);
		LINK(parent[w], w);
		for (it = buckets[parent[w]].begin(); it != buckets[parent[w]].end(); it++) {
			const int v = *it;
			const int u = EVAL(v);
			idom[v] = (semi[u] < semi[v]) ? u : parent[w];
		}
		buckets[parent[w]].clear();
	}

	for (int i = 1; i <= count; i++) {
		const int w = vertex[i];
		if (idom[w] != vertex[semi[w]]) {
			idom[w] = idom[idom[w]];
		}
	}
	idom[root] = root;

}